

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf16_inverse.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<kitty::static_truth_table<4U,_true>_> __l_00;
  reference pvVar1;
  ostream *poVar2;
  ostream *poVar3;
  vector<kitty::cube,_std::allocator<kitty::cube>_> cubes;
  int i;
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  y;
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  steps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chain;
  ostream *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  uint in_stack_fffffffffffffb6c;
  vector<kitty::cube,_std::allocator<kitty::cube>_> *in_stack_fffffffffffffb70;
  allocator_type *in_stack_fffffffffffffb78;
  allocator<char> *in_stack_fffffffffffffb80;
  iterator in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  string *local_440;
  static_truth_table<4U,_true> *in_stack_fffffffffffffce8;
  string local_308 [32];
  int local_2e8;
  uint64_t local_2e0;
  uint64_t local_2d8;
  uint64_t local_2d0;
  uint64_t local_2c8;
  uint64_t *local_2c0;
  undefined8 local_2b8;
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  local_2b0;
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  local_298;
  undefined1 local_27d;
  allocator<char> local_27c;
  allocator<char> local_27b;
  allocator<char> local_27a;
  allocator<char> local_279;
  allocator<char> local_278;
  allocator<char> local_277;
  allocator<char> local_276;
  allocator<char> local_275;
  allocator<char> local_274;
  allocator<char> local_273;
  allocator<char> local_272;
  allocator<char> local_271;
  allocator<char> local_270;
  allocator<char> local_26f;
  allocator<char> local_26e;
  allocator<char> local_26d [20];
  allocator<char> local_259;
  string *local_258;
  string local_250 [32];
  undefined1 local_230 [32];
  undefined1 local_210 [32];
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [32];
  undefined1 local_190 [32];
  undefined1 local_170 [32];
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  string *local_30;
  undefined8 local_28;
  int local_4;
  
  local_4 = 0;
  local_27d = 1;
  local_258 = local_250;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_258 = (string *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_27d = 0;
  local_30 = local_250;
  local_28 = 0x11;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10f00e);
  __l._M_len = (size_type)in_stack_fffffffffffffb90;
  __l._M_array = in_stack_fffffffffffffb88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffb80,__l,(allocator_type *)in_stack_fffffffffffffb78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10f042);
  local_440 = (string *)&local_30;
  do {
    local_440 = local_440 + -0x20;
    std::__cxx11::string::~string(local_440);
  } while (local_440 != local_250);
  std::allocator<char>::~allocator(&local_27c);
  std::allocator<char>::~allocator(&local_27b);
  std::allocator<char>::~allocator(&local_27a);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::~allocator(&local_278);
  std::allocator<char>::~allocator(&local_277);
  std::allocator<char>::~allocator(&local_276);
  std::allocator<char>::~allocator(&local_275);
  std::allocator<char>::~allocator(&local_274);
  std::allocator<char>::~allocator(&local_273);
  std::allocator<char>::~allocator(&local_272);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::~allocator(&local_270);
  std::allocator<char>::~allocator(&local_26f);
  std::allocator<char>::~allocator(&local_26e);
  std::allocator<char>::~allocator(local_26d);
  std::allocator<char>::~allocator(&local_259);
  std::
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::vector((vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
            *)0x10f170);
  kitty::create_multiple_from_chain<kitty::static_truth_table<4u,true>,void>
            ((uint)in_stack_fffffffffffffb80,
             (vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
              *)in_stack_fffffffffffffb78,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb70,
             (string *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  pvVar1 = std::
           vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
           ::operator[](&local_298,0x11);
  local_2e0 = pvVar1->_bits;
  pvVar1 = std::
           vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
           ::operator[](&local_298,0x12);
  local_2d8 = pvVar1->_bits;
  pvVar1 = std::
           vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
           ::operator[](&local_298,0x13);
  local_2d0 = pvVar1->_bits;
  pvVar1 = std::
           vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
           ::operator[](&local_298,0x14);
  local_2c8 = pvVar1->_bits;
  local_2c0 = &local_2e0;
  local_2b8 = 4;
  std::allocator<kitty::static_truth_table<4U,_true>_>::allocator
            ((allocator<kitty::static_truth_table<4U,_true>_> *)0x10f22b);
  __l_00._M_len = (size_type)in_stack_fffffffffffffb90;
  __l_00._M_array = (iterator)in_stack_fffffffffffffb88;
  std::
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::vector((vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
            *)in_stack_fffffffffffffb80,__l_00,in_stack_fffffffffffffb78);
  std::allocator<kitty::static_truth_table<4U,_true>_>::~allocator
            ((allocator<kitty::static_truth_table<4U,_true>_> *)0x10f25c);
  for (local_2e8 = 0; local_2e8 < 4; local_2e8 = local_2e8 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"y");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2e8 + 1);
    poVar3 = std::operator<<(poVar2," = ");
    std::
    vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
    ::operator[](&local_2b0,(long)local_2e8);
    kitty::to_hex<kitty::static_truth_table<4u,true>,void>(in_stack_fffffffffffffce8);
    poVar3 = std::operator<<(poVar3,local_308);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_308);
    std::
    vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
    ::operator[](&local_2b0,(long)local_2e8);
    kitty::esop_from_pprm<kitty::static_truth_table<4u,true>>
              ((static_truth_table<4U,_true> *)poVar2);
    kitty::print_cubes(in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb60
                      );
    std::vector<kitty::cube,_std::allocator<kitty::cube>_>::~vector
              ((vector<kitty::cube,_std::allocator<kitty::cube>_> *)in_stack_fffffffffffffb60);
  }
  std::ostream::operator<<(&std::cout,std::flush<char,std::char_traits<char>>);
  std::
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::~vector((vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
             *)in_stack_fffffffffffffb60);
  std::
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::~vector((vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
             *)in_stack_fffffffffffffb60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb60);
  return local_4;
}

Assistant:

int main()
{
  /* This is the Boolean chain described in Fig. 1 of [J. Boyar and R. Peralta,
     SEC (2012), 287-298] */
  std::vector<std::string> chain{
      "x5 = x3 ^ x4", "x6 = x1 & x3", "x7 = x2 ^ x6",
      "x8 = x1 ^ x2", "x9 = x4 ^ x6", "x10 = x8 & x9",
      "x11 = x5 & x7", "x12 = x1 & x4", "x13 = x8 & x12",
      "x14 = x8 ^ x13", "x15 = x2 & x3", "x16 = x5 & x15",
      "x17 = x5 ^ x16", "x18 = x6 ^ x17", "x19 = x4 ^ x11",
      "x20 = x6 ^ x14", "x21 = x2 ^ x10"};

  /* create truth tables */
  std::vector<kitty::static_truth_table<4>> steps;
  kitty::create_multiple_from_chain( 4, steps, chain );

  /* output functions are in the last four steps */
  std::vector<kitty::static_truth_table<4>> y{steps[17], steps[18], steps[19], steps[20]};

  /* for each output ... */
  for ( auto i = 0; i < 4; ++i )
  {
    /* print hex representation of function */
    std::cout << "y" << ( i + 1 ) << " = " << kitty::to_hex( y[i] ) << "\n";

    /* print PPRM (algebraic normal form) as in Sect. 3 of the above cited
       paper */
    const auto cubes = esop_from_pprm( y[i] );
    kitty::print_cubes( cubes, 4 );
  }

  std::cout << std::flush;
}